

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void Centaurus::LDFARoutineEM64T<wchar_t>::emit_state
               (X86Assembler *as,Label *rejectlabel,LDFAState<wchar_t> *state,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels)

{
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *this;
  Label *pLVar1;
  bool bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  int iVar5;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *this_00;
  reference this_01;
  CharClass<wchar_t> *this_02;
  reference this_03;
  CodeEmitter *in_stack_fffffffffffffd68;
  CodeEmitter *in_stack_fffffffffffffd70;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *in_stack_fffffffffffffd78;
  CodeEmitter *in_stack_fffffffffffffd80;
  Label *in_stack_fffffffffffffd88;
  Operand_ *in_stack_fffffffffffffd90;
  wchar_t in_stack_fffffffffffffd9c;
  CodeEmitter *in_stack_fffffffffffffda0;
  Range<wchar_t> *r;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  CharClass<wchar_t> *__range3;
  NFATransition<wchar_t> *tr;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range2;
  undefined4 local_1e0;
  undefined4 local_1dc;
  CodeEmitter *local_1d8;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels_local;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels_local;
  LDFAState<wchar_t> *state_local;
  Label *rejectlabel_local;
  X86Assembler *as_local;
  undefined8 local_1a8;
  Label *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  Label *local_188;
  LDFAState<wchar_t> *local_180;
  Label *local_178;
  undefined4 local_16c;
  undefined8 local_168;
  Label *local_160;
  reference local_158;
  Label *local_150;
  reference local_148;
  Label *local_140;
  int local_134;
  undefined8 local_130;
  Operand_ *local_128;
  wchar_t local_11c;
  undefined8 local_118;
  Label *local_110;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  **local_108;
  undefined8 local_100;
  X86Assembler *local_f8;
  wchar_t local_ec;
  undefined8 local_e8;
  Label *local_e0;
  reference local_d8;
  CodeEmitter *local_d0;
  reference local_c8;
  CodeEmitter *local_c0;
  undefined4 local_b4;
  undefined8 local_b0;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  **local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  uint32_t signature;
  undefined4 local_94;
  undefined8 local_90;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  **local_88;
  undefined1 *local_80;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  **local_78;
  undefined4 local_70;
  undefined4 local_6c;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  **local_50;
  undefined4 local_48;
  undefined4 local_44;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  **local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  wchar_t local_18;
  wchar_t local_14;
  int local_10;
  undefined4 local_c;
  
  local_a8 = &__range2;
  local_b0 = 0x23ca38;
  local_b4 = 0;
  local_88 = &__range2;
  local_90 = 0x23ca38;
  local_94 = 0;
  signature = 2;
  local_9c = 0;
  local_80 = &asmjit::NoInit;
  local_58 = &asmjit::NoInit;
  local_30 = 0x23ca38;
  local_20 = 0x23ca38;
  local_24 = 0x1f;
  local_28 = 3;
  local_a0 = 0x2000030;
  local_6c = 0x2000032;
  local_70 = 0;
  local_48 = 0;
  local_38 = 0;
  __range2 = (vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
              *)0x2000032;
  local_60 = 0x23ca38;
  local_1dc = 3;
  local_1e0 = 0;
  local_100 = 0x23ca08;
  local_108 = &__range2;
  local_1d8 = (CodeEmitter *)exitlabels;
  exitlabels_local = labels;
  labels_local = (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)state;
  state_local = (LDFAState<wchar_t> *)rejectlabel;
  rejectlabel_local = (Label *)as;
  local_f8 = as;
  local_78 = local_88;
  local_68 = local_88;
  local_50 = local_88;
  local_44 = local_6c;
  local_40 = local_88;
  local_34 = local_6c;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffd80,(uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20),
             (Operand_ *)in_stack_fffffffffffffd70,(Operand_ *)in_stack_fffffffffffffd68);
  local_188 = rejectlabel_local;
  local_190 = 0x23ca18;
  local_198 = 0x23ca08;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffd80,(uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20),
             (Operand_ *)in_stack_fffffffffffffd70,(Operand_ *)in_stack_fffffffffffffd68);
  local_160 = rejectlabel_local;
  local_168 = 0x23ca38;
  local_16c = 2;
  local_c = 2;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
             (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
  this_00 = LDFAState<wchar_t>::get_transitions((LDFAState<wchar_t> *)labels_local);
  __end0 = std::
           vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ::begin(this_00);
  tr = (NFATransition<wchar_t> *)
       std::
       vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
       ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                                     *)&tr), bVar2) {
    this_01 = __gnu_cxx::
              __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
              ::operator*(&__end0);
    this_02 = NFATransition<wchar_t>::label(this_01);
    __end0_1 = CharClass<wchar_t>::begin(this_02);
    r = (Range<wchar_t> *)CharClass<wchar_t>::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                               *)&r), bVar2) {
      this_03 = __gnu_cxx::
                __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                ::operator*(&__end0_1);
      wVar3 = Range<wchar_t>::start(this_03);
      wVar4 = Range<wchar_t>::end(this_03);
      pLVar1 = rejectlabel_local;
      if (wVar3 + L'\x01' == wVar4) {
        local_11c = Range<wchar_t>::start(this_03);
        local_110 = pLVar1;
        local_118 = 0x23ca08;
        local_14 = local_11c;
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                   (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
        iVar5 = NFATransition<wchar_t>::dest(this_01);
        pLVar1 = rejectlabel_local;
        this = exitlabels_local;
        if (iVar5 < 0) {
          in_stack_fffffffffffffda0 = local_1d8;
          iVar5 = NFATransition<wchar_t>::dest(this_01);
          local_158 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
                                 in_stack_fffffffffffffda0,(long)(-1 - iVar5));
          local_150 = pLVar1;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                     (Operand_ *)0x1826da);
        }
        else {
          iVar5 = NFATransition<wchar_t>::dest(this_01);
          local_148 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                                (this,(long)iVar5);
          local_140 = pLVar1;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                     (Operand_ *)0x18266b);
        }
      }
      else {
        in_stack_fffffffffffffd88 = rejectlabel_local;
        local_ec = Range<wchar_t>::start(this_03);
        local_e8 = 0x23ca08;
        local_e0 = in_stack_fffffffffffffd88;
        local_18 = local_ec;
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                   (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
        in_stack_fffffffffffffd90 = (Operand_ *)rejectlabel_local;
        in_stack_fffffffffffffd9c = Range<wchar_t>::end(this_03);
        wVar3 = Range<wchar_t>::start(this_03);
        local_134 = in_stack_fffffffffffffd9c - wVar3;
        local_130 = 0x23ca08;
        local_128 = in_stack_fffffffffffffd90;
        local_10 = local_134;
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
                   (int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
        iVar5 = NFATransition<wchar_t>::dest(this_01);
        if (iVar5 < 0) {
          in_stack_fffffffffffffd68 = local_1d8;
          in_stack_fffffffffffffd70 = (CodeEmitter *)rejectlabel_local;
          iVar5 = NFATransition<wchar_t>::dest(this_01);
          local_d8 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                               ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)
                                in_stack_fffffffffffffd68,(long)(-1 - iVar5));
          local_d0 = in_stack_fffffffffffffd70;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                     (Operand_ *)0x1828ad);
        }
        else {
          in_stack_fffffffffffffd78 = exitlabels_local;
          in_stack_fffffffffffffd80 = (CodeEmitter *)rejectlabel_local;
          iVar5 = NFATransition<wchar_t>::dest(this_01);
          local_c8 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                               (in_stack_fffffffffffffd78,(long)iVar5);
          local_c0 = in_stack_fffffffffffffd80;
          asmjit::CodeEmitter::emit
                    (in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                     (Operand_ *)0x18283e);
        }
        local_1a0 = rejectlabel_local;
        local_1a8 = 0x23ca08;
        as_local = (X86Assembler *)(asmjit::x86OpData + 0x490);
        asmjit::CodeEmitter::emit
                  (in_stack_fffffffffffffd80,(uint32_t)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                   (Operand_ *)in_stack_fffffffffffffd70,(Operand_ *)in_stack_fffffffffffffd68);
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
      ::operator++(&__end0_1);
    }
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  local_178 = rejectlabel_local;
  local_180 = state_local;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
             (Operand_ *)0x18295c);
  return;
}

Assistant:

void LDFARoutineEM64T<TCHAR>::emit_state(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const LDFAState<TCHAR>& state, std::vector<asmjit::Label>& labels, std::vector<asmjit::Label>& exitlabels)
{
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(PEEK_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(PEEK_REG, 0));
    as.mov(CHAR2_REG, CHAR_REG);
    if (sizeof(TCHAR) == 1)
        as.inc(PEEK_REG);
    else
        as.add(PEEK_REG, 2);

    for (const auto& tr : state.get_transitions())
    {
        for (const auto& r : tr.label())
        {
            if (r.start() + 1 == r.end())
            {
                as.cmp(CHAR_REG, r.start());
                if (tr.dest() >= 0)
                {
                    as.je(labels[tr.dest()]);
                }
                else
                {
                    as.je(exitlabels[-tr.dest() - 1]);
                }
            }
            else
            {
                as.sub(CHAR_REG, r.start());
                as.cmp(CHAR_REG, r.end() - r.start());
                if (tr.dest() >= 0)
                {
                    as.jb(labels[tr.dest()]);
                }
                else
                {
                    as.jb(exitlabels[-tr.dest() - 1]);
                }
                as.mov(CHAR_REG, CHAR2_REG);
            }
        }
    }
    as.jmp(rejectlabel);
}